

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

int enet_protocol_check_outgoing_commands(ENetHost *host,ENetPeer *peer)

{
  _ENetListNode **pp_Var1;
  byte *pbVar2;
  ENetList *pEVar3;
  ENetList *pEVar4;
  short *psVar5;
  ushort uVar6;
  short sVar7;
  short sVar8;
  uint32_t uVar9;
  size_t sVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  bool bVar22;
  bool bVar23;
  int iVar24;
  _ENetListNode *p_Var25;
  ulong uVar26;
  byte bVar27;
  long lVar28;
  ulong uVar29;
  byte bVar30;
  long lVar31;
  uint uVar32;
  long *plVar33;
  undefined4 *puVar34;
  ENetListIterator result;
  _ENetListNode *p_Var35;
  _ENetListNode *p_Var36;
  uint uVar37;
  bool bVar38;
  int local_94;
  _ENetListNode *local_70;
  long local_48;
  
  lVar28 = host->commandCount * 0x30 + 0x8c;
  lVar31 = host->bufferCount * 0x10 + 0x698;
  pEVar3 = &peer->outgoingCommands;
  local_70 = (peer->outgoingCommands).sentinel.next;
  if (local_70 == &pEVar3->sentinel) {
    local_94 = 1;
LAB_0010819a:
    host->commandCount = (lVar28 + -0x8c >> 4) * -0x5555555555555555;
    host->bufferCount = lVar31 + -0x698 >> 4;
    if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
        ((pEVar3->sentinel).next == &pEVar3->sentinel)) &&
       (((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel &&
        ((peer->sentUnreliableCommands).sentinel.next == &(peer->sentUnreliableCommands).sentinel)))
       ) {
      enet_peer_disconnect(peer,peer->eventData);
    }
    return local_94;
  }
  pEVar4 = &peer->sentReliableCommands;
  bVar22 = false;
  local_94 = 1;
  bVar23 = false;
  uVar37 = 0;
  local_48 = 0;
LAB_00107ccd:
  do {
    bVar30 = *(byte *)&local_70[2].previous;
    bVar38 = -1 < (char)bVar30;
    p_Var35 = local_70;
    if (!bVar38) {
      do {
        bVar27 = *(byte *)((long)&local_70[2].previous + 1);
        if ((ulong)bVar27 < peer->channelCount) {
          uVar6 = *(ushort *)&local_70[1].next;
          uVar37 = (uint)(uVar6 >> 0xc);
          if (peer->channels == (ENetChannel *)0x0) goto LAB_00107d9d;
          local_48 = (long)peer->channels->reliableWindows + ((ulong)((uint)bVar27 * 0x50) - 6);
          if ((!bVar22) &&
             (((uVar6 & 0xfff) != 0 || *(short *)((long)&local_70[2].next + 6) != 0 ||
              ((bVar22 = true, *(ushort *)(local_48 + 6 + (ulong)(uVar37 - 1 & 0xf) * 2) < 0x1000 &&
               (bVar27 = (byte)(uVar6 >> 0xc),
               ((0x3ffU >> (0x10 - bVar27 & 0x1f) | 0x3ff << bVar27) &
               (uint)*(ushort *)(local_48 + 4)) == 0)))))) {
            bVar22 = false;
            goto LAB_00107d9f;
          }
        }
        else {
          uVar37 = (uint)(*(ushort *)&local_70[1].next >> 0xc);
LAB_00107d9d:
          local_48 = 0;
LAB_00107d9f:
          if (local_70[5].previous == (_ENetListNode *)0x0) {
LAB_00107f43:
            local_94 = 0;
            p_Var35 = local_70;
            break;
          }
          if (!bVar23) {
            uVar32 = peer->windowSize * peer->packetThrottle >> 5;
            if (uVar32 <= peer->mtu) {
              uVar32 = peer->mtu;
            }
            bVar23 = true;
            if ((uint)*(ushort *)((long)&local_70[2].next + 4) + peer->reliableDataInTransit <=
                uVar32) {
              bVar23 = false;
              goto LAB_00107f43;
            }
          }
        }
        local_70 = local_70->next;
        if (local_70 == &pEVar3->sentinel) goto LAB_0010819a;
        bVar30 = *(byte *)&local_70[2].previous;
        bVar38 = (char)bVar30 >= '\0';
        p_Var35 = local_70;
      } while ((char)bVar30 < '\0');
    }
    if (0xa97 < lVar31 || 0x68b < lVar28) {
LAB_00108184:
      host->continueSending = 1;
      goto LAB_0010819a;
    }
    uVar26 = commandSizes[bVar30 & 0xf];
    sVar10 = host->packetSize;
    uVar29 = peer->mtu - sVar10;
    if (uVar29 < uVar26) goto LAB_00108184;
    p_Var36 = p_Var35[5].previous;
    if (p_Var36 == (_ENetListNode *)0x0) {
      plVar33 = (long *)((long)host->commands + lVar31 + -0x7c);
      local_70 = p_Var35->next;
      if (bVar38) {
        p_Var36 = p_Var35->previous;
        p_Var36->next = local_70;
        local_70->previous = p_Var36;
      }
      else {
LAB_00108016:
        if ((local_48 != 0) && (*(short *)((long)&p_Var35[2].next + 6) == 0)) {
          *(ushort *)(local_48 + 4) = *(ushort *)(local_48 + 4) | (ushort)(1 << (sbyte)uVar37);
          psVar5 = (short *)(local_48 + 6 + (ulong)uVar37 * 2);
          *psVar5 = *psVar5 + 1;
        }
        psVar5 = (short *)((long)&p_Var35[2].next + 6);
        *psVar5 = *psVar5 + 1;
        iVar24 = *(int *)&p_Var35[1].previous;
        if (iVar24 == 0) {
          iVar24 = peer->roundTripTimeVariance * 4 + peer->roundTripTime;
          *(int *)&p_Var35[1].previous = iVar24;
          *(uint32_t *)((long)&p_Var35[1].previous + 4) = peer->timeoutLimit * iVar24;
        }
        uVar9 = host->serviceTime;
        if ((pEVar4->sentinel).next == &pEVar4->sentinel) {
          peer->nextTimeout = iVar24 + uVar9;
        }
        p_Var36 = p_Var35->previous;
        p_Var36->next = local_70;
        local_70->previous = p_Var36;
        p_Var36 = (peer->sentReliableCommands).sentinel.previous;
        p_Var35->previous = p_Var36;
        p_Var35->next = &pEVar4->sentinel;
        p_Var36->next = p_Var35;
        (peer->sentReliableCommands).sentinel.previous = p_Var35;
        *(uint32_t *)((long)&p_Var35[1].next + 4) = uVar9;
        pbVar2 = (byte *)((long)&host->headerFlags + 1);
        *pbVar2 = *pbVar2 | 0x40;
        peer->reliableDataInTransit =
             peer->reliableDataInTransit + (uint)*(ushort *)((long)&p_Var35[2].next + 4);
      }
      goto LAB_001080d6;
    }
    if (((uint)uVar29 & 0xffff) <
        (uint)(ushort)(*(short *)((long)&p_Var35[2].next + 4) + (short)uVar26)) goto LAB_00108184;
    local_70 = p_Var35->next;
    if (!bVar38) {
      plVar33 = (long *)((long)host->commands + lVar31 + -0x7c);
      goto LAB_00108016;
    }
    if (((*(int *)&p_Var35[2].next != 0) || (((ulong)p_Var36->next & 0x20) != 0)) ||
       (uVar32 = peer->packetThrottleCounter + 7 & 0x1f, peer->packetThrottleCounter = uVar32,
       uVar32 <= peer->packetThrottle)) break;
    sVar7 = *(short *)&p_Var35[1].next;
    sVar8 = *(short *)((long)&p_Var35[1].next + 2);
    p_Var25 = local_70;
    while( true ) {
      local_70 = p_Var25;
      pp_Var1 = &p_Var36[1].previous;
      *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
      p_Var25 = local_70;
      if (*(int *)pp_Var1 == 0) {
        if (p_Var36[1].next != (_ENetListNode *)0x0) {
          (*(code *)p_Var36[1].next)(p_Var36);
        }
        (*(code *)callbacks_1)(p_Var36);
        p_Var25 = p_Var35->next;
      }
      p_Var36 = p_Var35->previous;
      p_Var36->next = p_Var25;
      p_Var25->previous = p_Var36;
      (*(code *)callbacks_1)(p_Var35);
      if (local_70 == &pEVar3->sentinel) goto LAB_0010819a;
      if ((*(short *)&local_70[1].next != sVar7) ||
         (*(short *)((long)&local_70[1].next + 2) != sVar8)) break;
      p_Var36 = local_70[5].previous;
      p_Var25 = local_70->next;
      p_Var35 = local_70;
    }
  } while( true );
  plVar33 = (long *)((long)host->commands + lVar31 + -0x7c);
  p_Var36 = p_Var35->previous;
  p_Var36->next = local_70;
  local_70->previous = p_Var36;
  p_Var36 = (peer->sentUnreliableCommands).sentinel.previous;
  p_Var35->previous = p_Var36;
  p_Var35->next = &(peer->sentUnreliableCommands).sentinel;
  p_Var36->next = p_Var35;
  (peer->sentUnreliableCommands).sentinel.previous = p_Var35;
LAB_001080d6:
  puVar34 = (undefined4 *)((long)&host->socket + lVar28);
  *(undefined4 **)((long)&host->socket + lVar31) = puVar34;
  *(ulong *)((long)&(host->address).field_0 + lVar31 + 4) = uVar26;
  host->packetSize = sVar10 + uVar26;
  uVar11 = *(undefined4 *)&p_Var35[2].previous;
  uVar12 = *(undefined4 *)((long)&p_Var35[2].previous + 4);
  uVar13 = *(undefined4 *)&p_Var35[3].next;
  uVar14 = *(undefined4 *)((long)&p_Var35[3].next + 4);
  uVar15 = *(undefined4 *)&p_Var35[3].previous;
  uVar16 = *(undefined4 *)((long)&p_Var35[3].previous + 4);
  uVar17 = *(undefined4 *)&p_Var35[4].next;
  uVar18 = *(undefined4 *)((long)&p_Var35[4].next + 4);
  uVar19 = *(undefined4 *)((long)&p_Var35[4].previous + 4);
  uVar20 = *(undefined4 *)&p_Var35[5].next;
  uVar21 = *(undefined4 *)((long)&p_Var35[5].next + 4);
  puVar34[8] = *(undefined4 *)&p_Var35[4].previous;
  puVar34[9] = uVar19;
  puVar34[10] = uVar20;
  puVar34[0xb] = uVar21;
  puVar34[4] = uVar15;
  puVar34[5] = uVar16;
  puVar34[6] = uVar17;
  puVar34[7] = uVar18;
  *puVar34 = uVar11;
  puVar34[1] = uVar12;
  puVar34[2] = uVar13;
  puVar34[3] = uVar14;
  if (p_Var35[5].previous == (_ENetListNode *)0x0) {
    if (-1 < *(char *)&p_Var35[2].previous) {
      (*(code *)callbacks_1)(p_Var35);
    }
  }
  else {
    *plVar33 = (long)&(p_Var35[5].previous)->previous->next + (ulong)*(uint *)&p_Var35[2].next;
    uVar26 = (ulong)*(ushort *)((long)&p_Var35[2].next + 4);
    plVar33[1] = uVar26;
    host->packetSize = host->packetSize + uVar26;
    lVar31 = lVar31 + 0x10;
  }
  peer->totalPacketsSent = peer->totalPacketsSent + 1;
  lVar28 = lVar28 + 0x30;
  lVar31 = lVar31 + 0x10;
  if (local_70 == &pEVar3->sentinel) goto LAB_0010819a;
  goto LAB_00107ccd;
}

Assistant:

static int enet_protocol_check_outgoing_commands(ENetHost* host, ENetPeer* peer) {
	ENetProtocol* command = &host->commands[host->commandCount];
	ENetBuffer* buffer = &host->buffers[host->bufferCount];
	ENetOutgoingCommand* outgoingCommand;
	ENetListIterator currentCommand;
	ENetChannel* channel = NULL;
	uint16_t reliableWindow = 0;
	size_t commandSize = 0;
	int windowExceeded = 0, windowWrap = 0, canPing = 1;
	currentCommand = enet_list_begin(&peer->outgoingCommands);

	while (currentCommand != enet_list_end(&peer->outgoingCommands)) {
		outgoingCommand = (ENetOutgoingCommand*)currentCommand;

		if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
			channel = outgoingCommand->command.header.channelID < peer->channelCount ? &peer->channels[outgoingCommand->command.header.channelID] : NULL;
			reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

			if (channel != NULL) {
				if (!windowWrap && outgoingCommand->sendAttempts < 1 && !(outgoingCommand->reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) && (channel->reliableWindows[(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE || channel->usedReliableWindows & ((((1 << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) << reliableWindow) | (((1 << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow)))))
					windowWrap = 1;

				if (windowWrap) {
					currentCommand = enet_list_next(currentCommand);

					continue;
				}
			}

			if (outgoingCommand->packet != NULL) {
				if (!windowExceeded) {
					uint32_t windowSize = (peer->packetThrottle * peer->windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;

					if (peer->reliableDataInTransit + outgoingCommand->fragmentLength > ENET_MAX(windowSize, peer->mtu))
						windowExceeded = 1;
				}

				if (windowExceeded) {
					currentCommand = enet_list_next(currentCommand);

					continue;
				}
			}

			canPing = 0;
		}

		commandSize = commandSizes[outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK];

		if (command >= &host->commands[sizeof(host->commands) / sizeof(ENetProtocol)] || buffer + 1 >= &host->buffers[sizeof(host->buffers) / sizeof(ENetBuffer)] || peer->mtu - host->packetSize < commandSize || (outgoingCommand->packet != NULL && (uint16_t)(peer->mtu - host->packetSize) < (uint16_t)(commandSize + outgoingCommand->fragmentLength))) {
			host->continueSending = 1;

			break;
		}

		currentCommand = enet_list_next(currentCommand);

		if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
			if (channel != NULL && outgoingCommand->sendAttempts < 1) {
				channel->usedReliableWindows |= 1 << reliableWindow;
				++channel->reliableWindows[reliableWindow];
			}

			++outgoingCommand->sendAttempts;

			if (outgoingCommand->roundTripTimeout == 0) {
				outgoingCommand->roundTripTimeout = peer->roundTripTime + 4 * peer->roundTripTimeVariance;
				outgoingCommand->roundTripTimeoutLimit = peer->timeoutLimit * outgoingCommand->roundTripTimeout;
			}

			if (enet_list_empty(&peer->sentReliableCommands))
				peer->nextTimeout = host->serviceTime + outgoingCommand->roundTripTimeout;

			enet_list_insert(enet_list_end(&peer->sentReliableCommands),
				enet_list_remove(&outgoingCommand->outgoingCommandList));

			outgoingCommand->sentTime = host->serviceTime;
			host->headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;
			peer->reliableDataInTransit += outgoingCommand->fragmentLength;
		}
		else {
			if (outgoingCommand->packet != NULL && outgoingCommand->fragmentOffset == 0 && !(outgoingCommand->packet->flags & (ENET_PACKET_FLAG_UNTHROTTLED))) {
				peer->packetThrottleCounter += ENET_PEER_PACKET_THROTTLE_COUNTER;
				peer->packetThrottleCounter %= ENET_PEER_PACKET_THROTTLE_SCALE;

				if (peer->packetThrottleCounter > peer->packetThrottle) {
					uint16_t reliableSequenceNumber = outgoingCommand->reliableSequenceNumber,

						unreliableSequenceNumber = outgoingCommand->unreliableSequenceNumber;

					for (;;) {
						--outgoingCommand->packet->referenceCount;

						if (outgoingCommand->packet->referenceCount == 0)
							enet_packet_destroy(outgoingCommand->packet);

						enet_list_remove(&outgoingCommand->outgoingCommandList);
						enet_free(outgoingCommand);

						if (currentCommand == enet_list_end(&peer->outgoingCommands))
							break;

						outgoingCommand = (ENetOutgoingCommand*)currentCommand;

						if (outgoingCommand->reliableSequenceNumber != reliableSequenceNumber || outgoingCommand->unreliableSequenceNumber != unreliableSequenceNumber)
							break;

						currentCommand = enet_list_next(currentCommand);
					}

					continue;
				}
			}

			enet_list_remove(&outgoingCommand->outgoingCommandList);

			if (outgoingCommand->packet != NULL)
				enet_list_insert(enet_list_end(&peer->sentUnreliableCommands), outgoingCommand);
		}

		buffer->data = command;
		buffer->dataLength = commandSize;
		host->packetSize += buffer->dataLength;
		*command = outgoingCommand->command;

		if (outgoingCommand->packet != NULL) {
			++buffer;
			buffer->data = outgoingCommand->packet->data + outgoingCommand->fragmentOffset;
			buffer->dataLength = outgoingCommand->fragmentLength;
			host->packetSize += outgoingCommand->fragmentLength;
		}
		else if (!(outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)) {
			enet_free(outgoingCommand);
		}

		++peer->totalPacketsSent;
		++command;
		++buffer;
	}

	host->commandCount = command - host->commands;
	host->bufferCount = buffer - host->buffers;

	if (peer->state == ENET_PEER_STATE_DISCONNECT_LATER && enet_list_empty(&peer->outgoingCommands) && enet_list_empty(&peer->sentReliableCommands) && enet_list_empty(&peer->sentUnreliableCommands))
		enet_peer_disconnect(peer, peer->eventData);

	return canPing;
}